

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O2

void terminal_bind_arrow(EditLine *el)

{
  keymacro_value_t *val;
  keymacro_value_t *val_00;
  keymacro_value_t *val_01;
  keymacro_value_t *val_02;
  keymacro_value_t *val_03;
  keymacro_value_t *val_04;
  funckey_t *pfVar1;
  byte *pbVar2;
  el_action_t eVar3;
  long lVar4;
  el_action_t *map;
  long lVar5;
  long lVar6;
  funckey_t *arrow;
  ulong uVar7;
  wchar_t wt_str [8];
  wchar_t local_58 [10];
  
  if (((el->el_terminal).t_buf != (char *)0x0) &&
     (map = (el->el_map).key, map != (el_action_t *)0x0)) {
    pfVar1 = (el->el_terminal).t_fkey;
    lVar4 = 0x408;
    if ((el->el_map).type == L'\x01') {
      map = (el->el_map).alt;
      lVar4 = 0x410;
    }
    lVar4 = *(long *)((long)&el->el_prog + lVar4);
    val = &pfVar1[1].fun;
    keymacro_add(el,(wchar_t *)terminal_reset_arrow_strA,val,pfVar1[1].type);
    val_00 = &pfVar1->fun;
    keymacro_add(el,(wchar_t *)terminal_reset_arrow_strB,val_00,pfVar1->type);
    val_01 = &pfVar1[3].fun;
    keymacro_add(el,(wchar_t *)terminal_reset_arrow_strC,val_01,pfVar1[3].type);
    val_02 = &pfVar1[2].fun;
    keymacro_add(el,(wchar_t *)terminal_reset_arrow_strD,val_02,pfVar1[2].type);
    val_03 = &pfVar1[4].fun;
    keymacro_add(el,(wchar_t *)terminal_reset_arrow_strH,val_03,pfVar1[4].type);
    val_04 = &pfVar1[5].fun;
    keymacro_add(el,(wchar_t *)terminal_reset_arrow_strF,val_04,pfVar1[5].type);
    keymacro_add(el,(wchar_t *)terminal_reset_arrow_stOA,val,pfVar1[1].type);
    keymacro_add(el,(wchar_t *)terminal_reset_arrow_stOB,val_00,pfVar1->type);
    keymacro_add(el,(wchar_t *)terminal_reset_arrow_stOC,val_01,pfVar1[3].type);
    keymacro_add(el,(wchar_t *)terminal_reset_arrow_stOD,val_02,pfVar1[2].type);
    keymacro_add(el,(wchar_t *)terminal_reset_arrow_stOH,val_03,pfVar1[4].type);
    keymacro_add(el,(wchar_t *)terminal_reset_arrow_stOF,val_04,pfVar1[5].type);
    if ((el->el_map).type == L'\x01') {
      keymacro_add(el,(wchar_t *)(terminal_reset_arrow_strA + 4),val,pfVar1[1].type);
      keymacro_add(el,(wchar_t *)(terminal_reset_arrow_strB + 4),val_00,pfVar1->type);
      keymacro_add(el,(wchar_t *)(terminal_reset_arrow_strC + 4),val_01,pfVar1[3].type);
      keymacro_add(el,(wchar_t *)(terminal_reset_arrow_strD + 4),val_02,pfVar1[2].type);
      keymacro_add(el,(wchar_t *)(terminal_reset_arrow_strH + 4),val_03,pfVar1[4].type);
      keymacro_add(el,(wchar_t *)(terminal_reset_arrow_strF + 4),val_04,pfVar1[5].type);
      keymacro_add(el,(wchar_t *)(terminal_reset_arrow_stOA + 4),val,pfVar1[1].type);
      keymacro_add(el,(wchar_t *)(terminal_reset_arrow_stOB + 4),val_00,pfVar1->type);
      keymacro_add(el,(wchar_t *)(terminal_reset_arrow_stOC + 4),val_01,pfVar1[3].type);
      keymacro_add(el,(wchar_t *)(terminal_reset_arrow_stOD + 4),val_02,pfVar1[2].type);
      keymacro_add(el,(wchar_t *)(terminal_reset_arrow_stOH + 4),val_03,pfVar1[4].type);
      keymacro_add(el,(wchar_t *)(terminal_reset_arrow_stOF + 4),val_04,pfVar1[5].type);
    }
    for (lVar6 = 0; lVar6 != 7; lVar6 = lVar6 + 1) {
      pbVar2 = (byte *)(el->el_terminal).t_str[pfVar1[lVar6].key];
      if ((pbVar2 != (byte *)0x0) && (*pbVar2 != 0)) {
        for (lVar5 = 0; (lVar5 != 8 && (pbVar2[lVar5] != 0)); lVar5 = lVar5 + 1) {
          local_58[lVar5] = (int)(char)pbVar2[lVar5];
        }
        for (; lVar5 != 8; lVar5 = lVar5 + 1) {
          local_58[lVar5] = L'\0';
        }
        if (pfVar1[lVar6].type == L'\x02') {
          keymacro_clear(el,map,local_58);
        }
        else {
          uVar7 = (ulong)*pbVar2;
          if (pbVar2[1] == 0) {
            eVar3 = map[uVar7];
          }
          else {
            eVar3 = map[uVar7];
            if ((*(el_action_t *)(lVar4 + uVar7) == eVar3) || (eVar3 == '\x19')) {
              keymacro_add(el,local_58,&pfVar1[lVar6].fun,pfVar1[lVar6].type);
              map[uVar7] = '\x19';
              goto LAB_00110a9f;
            }
          }
          if (eVar3 == '\x1c') {
            keymacro_clear(el,map,local_58);
            if (pfVar1[lVar6].type == L'\0') {
              map[uVar7] = pfVar1[lVar6].fun.cmd;
            }
            else {
              keymacro_add(el,local_58,&pfVar1[lVar6].fun,pfVar1[lVar6].type);
            }
          }
        }
      }
LAB_00110a9f:
    }
  }
  return;
}

Assistant:

libedit_private void
terminal_bind_arrow(EditLine *el)
{
	el_action_t *map;
	const el_action_t *dmap;
	int i, j;
	char *p;
	funckey_t *arrow = el->el_terminal.t_fkey;

	/* Check if the components needed are initialized */
	if (el->el_terminal.t_buf == NULL || el->el_map.key == NULL)
		return;

	map = el->el_map.type == MAP_VI ? el->el_map.alt : el->el_map.key;
	dmap = el->el_map.type == MAP_VI ? el->el_map.vic : el->el_map.emacs;

	terminal_reset_arrow(el);

	for (i = 0; i < A_K_NKEYS; i++) {
		wchar_t wt_str[VISUAL_WIDTH_MAX];
		wchar_t *px;
		size_t n;

		p = el->el_terminal.t_str[arrow[i].key];
		if (!p || !*p)
			continue;
		for (n = 0; n < VISUAL_WIDTH_MAX && p[n]; ++n)
			wt_str[n] = p[n];
		while (n < VISUAL_WIDTH_MAX)
			wt_str[n++] = '\0';
		px = wt_str;
		j = (unsigned char) *p;
		/*
		 * Assign the arrow keys only if:
		 *
		 * 1. They are multi-character arrow keys and the user
		 *    has not re-assigned the leading character, or
		 *    has re-assigned the leading character to be
		 *	  ED_SEQUENCE_LEAD_IN
		 * 2. They are single arrow keys pointing to an
		 *    unassigned key.
		 */
		if (arrow[i].type == XK_NOD)
			keymacro_clear(el, map, px);
		else {
			if (p[1] && (dmap[j] == map[j] ||
				map[j] == ED_SEQUENCE_LEAD_IN)) {
				keymacro_add(el, px, &arrow[i].fun,
				    arrow[i].type);
				map[j] = ED_SEQUENCE_LEAD_IN;
			} else if (map[j] == ED_UNASSIGNED) {
				keymacro_clear(el, map, px);
				if (arrow[i].type == XK_CMD)
					map[j] = arrow[i].fun.cmd;
				else
					keymacro_add(el, px, &arrow[i].fun,
					    arrow[i].type);
			}
		}
	}
}